

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  int iVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [32];
  ulong uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  auVar8 = _DAT_005a56e0;
  auVar7 = _DAT_005a56c0;
  auVar25 = in_ZMM3._0_16_;
  iVar1 = bottom_top_blob->elempack;
  iVar10 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar9 = bottom_top_blob->h;
  iVar3 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar10 == 2) {
    if ((int)uVar9 < 1) {
      return 0;
    }
    uVar16 = iVar1 * iVar2;
    uVar14 = 0;
    auVar23._8_8_ = 0x8000000000000000;
    auVar23._0_8_ = 0x8000000000000000;
    auVar25 = vpcmpeqd_avx(auVar25,auVar25);
    do {
      pvVar5 = (this->super_BatchNorm).a_data.data;
      pvVar6 = (this->super_BatchNorm).b_data.data;
      uVar22 = *(uint *)((long)pvVar5 + uVar14 * 4);
      uVar13 = *(uint *)((long)pvVar6 + uVar14 * 4);
      auVar24 = ZEXT416(uVar22);
      if (iVar1 == 4) {
        auVar30 = *(undefined1 (*) [16])((long)pvVar5 + uVar14 * 0x10);
        auVar32._16_16_ = auVar30;
        auVar32._0_16_ = auVar30;
        auVar31 = *(undefined1 (*) [16])((long)pvVar6 + uVar14 * 0x10);
LAB_00140ff0:
        auVar38._16_16_ = auVar31;
        auVar38._0_16_ = auVar31;
      }
      else {
        auVar30 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        auVar31 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
        if (iVar1 != 8) {
          auVar34 = vshufps_avx(auVar24,auVar24,0);
          auVar32._16_16_ = auVar34;
          auVar32._0_16_ = auVar34;
          goto LAB_00140ff0;
        }
        auVar32 = *(undefined1 (*) [32])((long)pvVar5 + uVar14 * 0x20);
        auVar38 = *(undefined1 (*) [32])((long)pvVar6 + uVar14 * 0x20);
      }
      pauVar15 = (undefined1 (*) [32])
                 ((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar22 = 0;
      if (7 < (int)uVar16) {
        iVar12 = 7;
        do {
          auVar34 = vfmadd132ps_fma(*pauVar15,auVar32,auVar38);
          *pauVar15 = ZEXT1632(auVar34);
          pauVar15 = pauVar15 + 1;
          iVar12 = iVar12 + 8;
          uVar22 = uVar16 & 0xfffffff8;
        } while (iVar12 < (int)uVar16);
      }
      uVar17 = uVar22 | 3;
      while ((int)uVar17 < (int)uVar16) {
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar15,auVar30,auVar31);
        *(undefined1 (*) [16])*pauVar15 = auVar34;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        uVar17 = uVar22 + 7;
        uVar22 = uVar22 + 4;
      }
      if ((int)uVar22 < (int)uVar16) {
        uVar19 = CONCAT44(0,~uVar22 + uVar16);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar19;
        auVar31 = vpshufd_avx(auVar30,0x44);
        auVar30 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
        auVar28._16_16_ = auVar30;
        auVar28._0_16_ = auVar30;
        auVar24 = vshufps_avx(auVar24,auVar24,0);
        auVar26._16_16_ = auVar24;
        auVar26._0_16_ = auVar24;
        auVar24 = vorps_avx(auVar31,auVar23);
        auVar30 = vorps_avx(auVar31,auVar23);
        uVar21 = 0;
        do {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar21;
          auVar34 = vpshufd_avx(auVar34,0x44);
          auVar39._16_16_ = auVar34;
          auVar39._0_16_ = auVar34;
          auVar32 = vorps_avx(auVar39,auVar7);
          auVar38 = vorps_avx(auVar39,auVar8);
          auVar34 = vorps_avx(auVar31,auVar23);
          auVar46._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar38._24_4_;
          auVar46._12_4_ = auVar38._28_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar46,auVar34);
          auVar35._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
          auVar35._8_4_ = auVar38._8_4_;
          auVar35._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar35,auVar24);
          auVar46 = vpackssdw_avx(auVar35,auVar46);
          auVar47._0_8_ = auVar32._16_8_ ^ 0x8000000000000000;
          auVar47._8_4_ = auVar32._24_4_;
          auVar47._12_4_ = auVar32._28_4_ ^ 0x80000000;
          auVar34 = vpcmpgtq_avx(auVar47,auVar34);
          auVar44._0_8_ = auVar32._0_8_ ^ 0x8000000000000000;
          auVar44._8_4_ = auVar32._8_4_;
          auVar44._12_4_ = auVar32._12_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar44,auVar30);
          auVar34 = vpackssdw_avx(auVar35,auVar34);
          auVar34 = vpackssdw_avx(auVar34 ^ auVar25,auVar46 ^ auVar25);
          auVar46 = vpmovsxwd_avx(auVar34);
          auVar34 = vpunpckhwd_avx(auVar34,auVar34);
          auVar40._16_16_ = auVar34;
          auVar40._0_16_ = auVar46;
          auVar32 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])(*pauVar15 + uVar21 * 4));
          auVar34 = vfmadd213ps_fma(auVar32,auVar28,auVar26);
          auVar32 = vmaskmovps_avx(auVar40,ZEXT1632(auVar34));
          *(undefined1 (*) [32])(*pauVar15 + uVar21 * 4) = auVar32;
          uVar21 = uVar21 + 8;
        } while ((uVar19 + 8 & 0x1fffffff8) != uVar21);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar9);
  }
  else if (iVar10 == 1) {
    pauVar15 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar11 = (undefined1 (*) [32])(this->super_BatchNorm).a_data.data;
    pauVar20 = (undefined1 (*) [32])(this->super_BatchNorm).b_data.data;
    uVar22 = iVar1 * iVar2;
    uVar16 = 0;
    if (7 < (int)uVar22) {
      uVar16 = uVar22 & 0x7ffffff8;
      iVar12 = 7;
      do {
        auVar23 = vfmadd213ps_fma(*pauVar20,*pauVar15,*pauVar11);
        *pauVar15 = ZEXT1632(auVar23);
        pauVar15 = pauVar15 + 1;
        pauVar11 = pauVar11 + 1;
        pauVar20 = pauVar20 + 1;
        iVar12 = iVar12 + 8;
      } while (iVar12 < (int)uVar22);
    }
    uVar13 = uVar16 | 3;
    while ((int)uVar13 < (int)uVar22) {
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar20,*(undefined1 (*) [16])*pauVar15,
                                *(undefined1 (*) [16])*pauVar11);
      *(undefined1 (*) [16])*pauVar15 = auVar23;
      pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
      pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
      uVar13 = uVar16 + 7;
      uVar16 = uVar16 + 4;
    }
    if (uVar22 - uVar16 != 0 && (int)uVar16 <= (int)uVar22) {
      lVar18 = 0;
      do {
        auVar23 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar15 + lVar18 * 4)),
                                  ZEXT416(*(uint *)(*pauVar20 + lVar18 * 4)),
                                  ZEXT416(*(uint *)(*pauVar11 + lVar18 * 4)));
        *(int *)(*pauVar15 + lVar18 * 4) = auVar23._0_4_;
        lVar18 = lVar18 + 1;
      } while (uVar22 - uVar16 != (int)lVar18);
    }
  }
  auVar8 = _DAT_005a56e0;
  auVar7 = _DAT_005a56c0;
  if ((iVar10 - 3U < 2) && (0 < (int)uVar4)) {
    uVar9 = iVar2 * iVar1 * uVar9 * iVar3;
    uVar14 = 0;
    auVar24._8_8_ = 0x8000000000000000;
    auVar24._0_8_ = 0x8000000000000000;
    auVar25 = vpcmpeqd_avx(auVar25,auVar25);
    do {
      pvVar5 = (this->super_BatchNorm).a_data.data;
      pvVar6 = (this->super_BatchNorm).b_data.data;
      uVar16 = *(uint *)((long)pvVar5 + uVar14 * 4);
      uVar22 = *(uint *)((long)pvVar6 + uVar14 * 4);
      auVar23 = ZEXT416(uVar16);
      if (iVar1 == 4) {
        auVar30 = *(undefined1 (*) [16])((long)pvVar5 + uVar14 * 0x10);
        auVar33._16_16_ = auVar30;
        auVar33._0_16_ = auVar30;
        auVar31 = *(undefined1 (*) [16])((long)pvVar6 + uVar14 * 0x10);
LAB_00141233:
        auVar41._16_16_ = auVar31;
        auVar41._0_16_ = auVar31;
      }
      else {
        auVar30 = vshufps_avx(ZEXT416(uVar16),ZEXT416(uVar16),0);
        auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        if (iVar1 != 8) {
          auVar34 = vshufps_avx(auVar23,auVar23,0);
          auVar33._16_16_ = auVar34;
          auVar33._0_16_ = auVar34;
          goto LAB_00141233;
        }
        auVar33 = *(undefined1 (*) [32])((long)pvVar5 + uVar14 * 0x20);
        auVar41 = *(undefined1 (*) [32])((long)pvVar6 + uVar14 * 0x20);
      }
      pauVar15 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar16 = 0;
      if (7 < (int)uVar9) {
        iVar10 = 7;
        do {
          auVar34 = vfmadd132ps_fma(*pauVar15,auVar33,auVar41);
          *pauVar15 = ZEXT1632(auVar34);
          pauVar15 = pauVar15 + 1;
          iVar10 = iVar10 + 8;
          uVar16 = uVar9 & 0xfffffff8;
        } while (iVar10 < (int)uVar9);
      }
      uVar13 = uVar16 | 3;
      while ((int)uVar13 < (int)uVar9) {
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar15,auVar30,auVar31);
        *(undefined1 (*) [16])*pauVar15 = auVar34;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        uVar13 = uVar16 + 7;
        uVar16 = uVar16 + 4;
      }
      if ((int)uVar16 < (int)uVar9) {
        uVar19 = CONCAT44(0,~uVar16 + uVar9);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar19;
        auVar31 = vpshufd_avx(auVar31,0x44);
        auVar30 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        auVar29._16_16_ = auVar30;
        auVar29._0_16_ = auVar30;
        auVar23 = vshufps_avx(auVar23,auVar23,0);
        auVar27._16_16_ = auVar23;
        auVar27._0_16_ = auVar23;
        auVar23 = vorps_avx(auVar31,auVar24);
        auVar30 = vorps_avx(auVar31,auVar24);
        uVar21 = 0;
        do {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar21;
          auVar34 = vpshufd_avx(auVar36,0x44);
          auVar42._16_16_ = auVar34;
          auVar42._0_16_ = auVar34;
          auVar32 = vorps_avx(auVar42,auVar7);
          auVar38 = vorps_avx(auVar42,auVar8);
          auVar34 = vorps_avx(auVar31,auVar24);
          auVar48._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar38._24_4_;
          auVar48._12_4_ = auVar38._28_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar48,auVar34);
          auVar37._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
          auVar37._8_4_ = auVar38._8_4_;
          auVar37._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar37,auVar23);
          auVar46 = vpackssdw_avx(auVar35,auVar46);
          auVar49._0_8_ = auVar32._16_8_ ^ 0x8000000000000000;
          auVar49._8_4_ = auVar32._24_4_;
          auVar49._12_4_ = auVar32._28_4_ ^ 0x80000000;
          auVar34 = vpcmpgtq_avx(auVar49,auVar34);
          auVar45._0_8_ = auVar32._0_8_ ^ 0x8000000000000000;
          auVar45._8_4_ = auVar32._8_4_;
          auVar45._12_4_ = auVar32._12_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar45,auVar30);
          auVar34 = vpackssdw_avx(auVar35,auVar34);
          auVar34 = vpackssdw_avx(auVar34 ^ auVar25,auVar46 ^ auVar25);
          auVar46 = vpmovsxwd_avx(auVar34);
          auVar34 = vpunpckhwd_avx(auVar34,auVar34);
          auVar43._16_16_ = auVar34;
          auVar43._0_16_ = auVar46;
          auVar32 = vmaskmovps_avx(auVar43,*(undefined1 (*) [32])(*pauVar15 + uVar21 * 4));
          auVar34 = vfmadd213ps_fma(auVar32,auVar29,auVar27);
          auVar32 = vmaskmovps_avx(auVar43,ZEXT1632(auVar34));
          *(undefined1 (*) [32])(*pauVar15 + uVar21 * 4) = auVar32;
          uVar21 = uVar21 + 8;
        } while ((uVar19 + 8 & 0x1fffffff8) != uVar21);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar4);
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}